

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O3

void __thiscall jaegertracing::SpanContext::SpanContext(SpanContext *this,SpanContext *ctx)

{
  pointer pcVar1;
  uint64_t uVar2;
  size_t sVar3;
  undefined4 uVar4;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_20;
  
  (this->super_SpanContext)._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00264a78;
  uVar2 = (ctx->_traceID)._low;
  (this->_traceID)._high = (ctx->_traceID)._high;
  (this->_traceID)._low = uVar2;
  uVar2 = ctx->_parentID;
  this->_spanID = ctx->_spanID;
  this->_parentID = uVar2;
  this->_flags = ctx->_flags;
  local_20._M_h = (__hashtable_alloc *)&this->_baggage;
  (this->_baggage)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_baggage)._M_h._M_bucket_count = (ctx->_baggage)._M_h._M_bucket_count;
  (this->_baggage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_baggage)._M_h._M_element_count = (ctx->_baggage)._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(ctx->_baggage)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (ctx->_baggage)._M_h._M_rehash_policy._M_next_resize;
  (this->_baggage)._M_h._M_rehash_policy._M_max_load_factor =
       (ctx->_baggage)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->_baggage)._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->_baggage)._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->_baggage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_20._M_h,&(ctx->_baggage)._M_h,&local_20);
  (this->_debugID)._M_dataplus._M_p = (pointer)&(this->_debugID).field_2;
  pcVar1 = (ctx->_debugID)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_debugID,pcVar1,pcVar1 + (ctx->_debugID)._M_string_length);
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

SpanContext(const SpanContext& ctx)
        : _traceID(ctx._traceID)
        , _spanID(ctx._spanID)
        , _parentID(ctx._parentID)
        , _flags(ctx._flags)
        , _baggage(ctx._baggage)
        , _debugID(ctx._debugID)
    {
    }